

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBoolean.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptBoolean::GetDiagValueString
          (JavascriptBoolean *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  charcount_t countNeeded;
  JavascriptString *this_00;
  char16 *str;
  Type *this_01;
  
  this_01 = &((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->stringCache;
  if (this->value == 0) {
    this_00 = StringCache::GetFalseDisplay(this_01);
  }
  else {
    this_00 = StringCache::GetTrueDisplay(this_01);
  }
  str = JavascriptString::GetString(this_00);
  countNeeded = JavascriptString::GetLength(this_00);
  StringBuilder<Memory::ArenaAllocator>::EnsureBuffer(stringBuilder,countNeeded);
  JavascriptString::CopyHelper(stringBuilder->appendPtr,str,countNeeded);
  stringBuilder->appendPtr = stringBuilder->appendPtr + countNeeded;
  stringBuilder->count = stringBuilder->count + countNeeded;
  return 1;
}

Assistant:

BOOL JavascriptBoolean::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        if (this->GetValue())
        {
            JavascriptString* trueDisplayString = GetLibrary()->GetTrueDisplayString();
            stringBuilder->Append(trueDisplayString->GetString(), trueDisplayString->GetLength());
        }
        else
        {
            JavascriptString* falseDisplayString = GetLibrary()->GetFalseDisplayString();
            stringBuilder->Append(falseDisplayString->GetString(), falseDisplayString->GetLength());
        }
        return TRUE;
    }